

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acutest.h
# Opt level: O0

int acutest_cmdline_read_
              (ACUTEST_CMDLINE_OPTION_ *options,int argc,char **argv,
              _func_int_int_char_ptr *callback)

{
  bool bVar1;
  int iVar2;
  size_t __n;
  char *pcVar3;
  size_t local_98;
  size_t len_1;
  char *assignment;
  char *badoptname;
  size_t len;
  int local_70;
  int ret;
  int i;
  int after_doubledash;
  char auxbuf [33];
  ACUTEST_CMDLINE_OPTION_ *local_38;
  ACUTEST_CMDLINE_OPTION_ *opt;
  _func_int_int_char_ptr *callback_local;
  char **argv_local;
  int argc_local;
  ACUTEST_CMDLINE_OPTION_ *options_local;
  
  bVar1 = false;
  local_70 = 1;
  len._4_4_ = 0;
  auxbuf[0x18] = '\0';
  do {
    if (argc <= local_70) {
      return len._4_4_;
    }
    if ((bVar1) || (iVar2 = strcmp(argv[local_70],"-"), iVar2 == 0)) {
      len._4_4_ = (*callback)(0,argv[local_70]);
    }
    else {
      iVar2 = strcmp(argv[local_70],"--");
      if (iVar2 == 0) {
        bVar1 = true;
      }
      else {
        local_38 = options;
        if (*argv[local_70] == '-') {
          for (; local_38->id != 0; local_38 = local_38 + 1) {
            if ((local_38->longname == (char *)0x0) ||
               (iVar2 = strncmp(argv[local_70],"--",2), iVar2 != 0)) {
              if ((local_38->shortname != '\0') &&
                 ((*argv[local_70] == '-' && (argv[local_70][1] == local_38->shortname)))) {
                if ((local_38->flags & 2) == 0) {
                  len._4_4_ = (*callback)(local_38->id,(char *)0x0);
                  if ((len._4_4_ == 0) && (argv[local_70][2] != '\0')) {
                    len._4_4_ = acutest_cmdline_handle_short_opt_group_
                                          (options,argv[local_70] + 2,callback);
                  }
                }
                else if (argv[local_70][2] == '\0') {
                  if (local_70 + 1 < argc) {
                    local_70 = local_70 + 1;
                    len._4_4_ = (*callback)(local_38->id,argv[local_70]);
                  }
                  else {
                    len._4_4_ = (*callback)(-0x7ffffffe,argv[local_70]);
                  }
                }
                else {
                  len._4_4_ = (*callback)(local_38->id,argv[local_70] + 2);
                }
                break;
              }
            }
            else {
              __n = strlen(local_38->longname);
              iVar2 = strncmp(argv[local_70] + 2,local_38->longname,__n);
              if (iVar2 == 0) {
                if (argv[local_70][__n + 2] == '\0') {
                  if ((local_38->flags & 2) == 0) {
                    len._4_4_ = (*callback)(local_38->id,(char *)0x0);
                  }
                  else {
                    len._4_4_ = (*callback)(-0x7ffffffe,argv[local_70]);
                  }
                  break;
                }
                if (argv[local_70][__n + 2] == '=') {
                  if ((local_38->flags & 3) == 0) {
                    snprintf((char *)&i,0x21,"--%s",local_38->longname);
                    len._4_4_ = (*callback)(-0x7ffffffd,(char *)&i);
                  }
                  else {
                    len._4_4_ = (*callback)(local_38->id,argv[local_70] + __n + 3);
                  }
                  break;
                }
              }
            }
          }
          if (local_38->id == 0) {
            if (*argv[local_70] == '-') {
              assignment = argv[local_70];
              iVar2 = strncmp(assignment,"--",2);
              if ((iVar2 == 0) && (pcVar3 = strchr(assignment,0x3d), pcVar3 != (char *)0x0)) {
                local_98 = (long)pcVar3 - (long)assignment;
                if (0x20 < local_98) {
                  local_98 = 0x20;
                }
                strncpy((char *)&i,assignment,local_98);
                *(undefined1 *)((long)&i + local_98) = 0;
                assignment = (char *)&i;
              }
              len._4_4_ = (*callback)(-0x7fffffff,assignment);
            }
            else {
              len._4_4_ = (*callback)(0,argv[local_70]);
            }
          }
        }
        else {
          len._4_4_ = (*callback)(0,argv[local_70]);
        }
      }
    }
    if (len._4_4_ != 0) {
      return len._4_4_;
    }
    local_70 = local_70 + 1;
  } while( true );
}

Assistant:

static int
acutest_cmdline_read_(const ACUTEST_CMDLINE_OPTION_* options, int argc, char** argv,
                      int (*callback)(int /*optval*/, const char* /*arg*/))
{

    const ACUTEST_CMDLINE_OPTION_* opt;
    char auxbuf[ACUTEST_CMDLINE_AUXBUF_SIZE_+1];
    int after_doubledash = 0;
    int i = 1;
    int ret = 0;

    auxbuf[ACUTEST_CMDLINE_AUXBUF_SIZE_] = '\0';

    while(i < argc) {
        if(after_doubledash  ||  strcmp(argv[i], "-") == 0) {
            /* Non-option argument. */
            ret = callback(ACUTEST_CMDLINE_OPTID_NONE_, argv[i]);
        } else if(strcmp(argv[i], "--") == 0) {
            /* End of options. All the remaining members are non-option arguments. */
            after_doubledash = 1;
        } else if(argv[i][0] != '-') {
            /* Non-option argument. */
            ret = callback(ACUTEST_CMDLINE_OPTID_NONE_, argv[i]);
        } else {
            for(opt = options; opt->id != 0; opt++) {
                if(opt->longname != NULL  &&  strncmp(argv[i], "--", 2) == 0) {
                    size_t len = strlen(opt->longname);
                    if(strncmp(argv[i]+2, opt->longname, len) == 0) {
                        /* Regular long option. */
                        if(argv[i][2+len] == '\0') {
                            /* with no argument provided. */
                            if(!(opt->flags & ACUTEST_CMDLINE_OPTFLAG_REQUIREDARG_))
                                ret = callback(opt->id, NULL);
                            else
                                ret = callback(ACUTEST_CMDLINE_OPTID_MISSINGARG_, argv[i]);
                            break;
                        } else if(argv[i][2+len] == '=') {
                            /* with an argument provided. */
                            if(opt->flags & (ACUTEST_CMDLINE_OPTFLAG_OPTIONALARG_ | ACUTEST_CMDLINE_OPTFLAG_REQUIREDARG_)) {
                                ret = callback(opt->id, argv[i]+2+len+1);
                            } else {
                                snprintf(auxbuf, sizeof(auxbuf), "--%s", opt->longname);
                                ret = callback(ACUTEST_CMDLINE_OPTID_BOGUSARG_, auxbuf);
                            }
                            break;
                        } else {
                            continue;
                        }
                    }
                } else if(opt->shortname != '\0'  &&  argv[i][0] == '-') {
                    if(argv[i][1] == opt->shortname) {
                        /* Regular short option. */
                        if(opt->flags & ACUTEST_CMDLINE_OPTFLAG_REQUIREDARG_) {
                            if(argv[i][2] != '\0')
                                ret = callback(opt->id, argv[i]+2);
                            else if(i+1 < argc)
                                ret = callback(opt->id, argv[++i]);
                            else
                                ret = callback(ACUTEST_CMDLINE_OPTID_MISSINGARG_, argv[i]);
                            break;
                        } else {
                            ret = callback(opt->id, NULL);

                            /* There might be more (argument-less) short options
                             * grouped together. */
                            if(ret == 0  &&  argv[i][2] != '\0')
                                ret = acutest_cmdline_handle_short_opt_group_(options, argv[i]+2, callback);
                            break;
                        }
                    }
                }
            }

            if(opt->id == 0) {  /* still not handled? */
                if(argv[i][0] != '-') {
                    /* Non-option argument. */
                    ret = callback(ACUTEST_CMDLINE_OPTID_NONE_, argv[i]);
                } else {
                    /* Unknown option. */
                    char* badoptname = argv[i];

                    if(strncmp(badoptname, "--", 2) == 0) {
                        /* Strip any argument from the long option. */
                        char* assignment = strchr(badoptname, '=');
                        if(assignment != NULL) {
                            size_t len = (size_t)(assignment - badoptname);
                            if(len > ACUTEST_CMDLINE_AUXBUF_SIZE_)
                                len = ACUTEST_CMDLINE_AUXBUF_SIZE_;
                            strncpy(auxbuf, badoptname, len);
                            auxbuf[len] = '\0';
                            badoptname = auxbuf;
                        }
                    }

                    ret = callback(ACUTEST_CMDLINE_OPTID_UNKNOWN_, badoptname);
                }
            }
        }

        if(ret != 0)
            return ret;
        i++;
    }

    return ret;
}